

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_types.h
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::CompactUnicodeString<4>::operator==
          (CompactUnicodeString<4> *this,CompactUnicodeString<4> *other)

{
  UBool UVar1;
  UnicodeString local_98;
  UnicodeString local_58;
  CompactUnicodeString<4> *local_18;
  CompactUnicodeString<4> *other_local;
  CompactUnicodeString<4> *this_local;
  
  local_18 = other;
  other_local = this;
  toAliasedUnicodeString(&local_58,this);
  toAliasedUnicodeString(&local_98,local_18);
  UVar1 = icu_63::UnicodeString::operator==(&local_58,&local_98);
  icu_63::UnicodeString::~UnicodeString(&local_98);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  return UVar1 != '\0';
}

Assistant:

bool operator==(const CompactUnicodeString& other) const {
        // Use the alias-only constructor and then call UnicodeString operator==
        return toAliasedUnicodeString() == other.toAliasedUnicodeString();
    }